

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

void __thiscall Strings::QuotedEncoding::quoteChar(QuotedEncoding *this,char c)

{
  int iVar1;
  
  iVar1 = this->lastOne;
  if (iVar1 != -1) {
    if (c == '\n' && iVar1 == 0xd) {
      writeASCII(this,'\r');
      iVar1 = this->lastOne;
LAB_00111dbd:
      writeHex(this,(char)iVar1);
    }
    else {
      if ((c == '\r') || (c == '\n')) goto LAB_00111dbd;
      writeASCII(this,(char)iVar1);
    }
    this->lastOne = -1;
  }
  if (c != ' ') {
    if ((c != '\n') && (c != '\r')) {
      if (c == '\t') goto LAB_00111de0;
      if (c == '=' || 0x5d < (byte)(c - 0x21U)) {
        writeHex(this,c);
        return;
      }
    }
    writeASCII(this,c);
    return;
  }
LAB_00111de0:
  this->lastOne = (uint)(byte)c;
  return;
}

Assistant:

inline void quoteChar(const char c)
        {
            if (lastOne != -1)
            {
                // CRLF is allowed on end of line
                if (lastOne == '\r' && c == '\n')
			        writeASCII((char)lastOne);
	            if (c == '\r' || c == '\n')
		            writeHex((char)lastOne);
	            else writeASCII((char)lastOne);

	            lastOne = -1;
            }
            if (c == '\t' || c == ' ') lastOne = (int)c;
            else if (c == '\r' || c == '\n' || (c > 32 && c < 127 && c != '=')) writeASCII(c);
            else writeHex(c);
        }